

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O0

Config * flatbuffers::java::anon_unknown_0::JavaDefaultConfig(void)

{
  Config *in_RDI;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11 [9];
  
  in_RDI->types = kKeep;
  in_RDI->constants = kScreamingSnake;
  in_RDI->methods = kLowerCamel;
  in_RDI->functions = kLowerCamel;
  in_RDI->fields = kLowerCamel;
  in_RDI->variables = kLowerCamel;
  in_RDI->variants = kKeep;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->enum_variant_seperator,".",local_11);
  in_RDI->escape_keywords = AfterConvertingCase;
  in_RDI->namespaces = kKeep;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->namespace_seperator,".",local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_RDI->object_prefix,"",&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_RDI->object_suffix,"T",&local_27)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_RDI->keyword_prefix,"",&local_28)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->keyword_suffix,"_",&local_29);
  in_RDI->filenames = kKeep;
  in_RDI->directories = kKeep;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&in_RDI->output_path,"",&local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->filename_suffix,"_generated",&local_2b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in_RDI->filename_extension,".java",&local_2c);
  std::allocator<char>::~allocator(&local_2c);
  std::allocator<char>::~allocator(&local_2b);
  std::allocator<char>::~allocator(&local_2a);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::~allocator(&local_28);
  std::allocator<char>::~allocator(&local_27);
  std::allocator<char>::~allocator(&local_26);
  std::allocator<char>::~allocator(local_25);
  std::allocator<char>::~allocator(local_11);
  return in_RDI;
}

Assistant:

static Namer::Config JavaDefaultConfig() {
  return {
    /*types=*/Case::kKeep,
    /*constants=*/Case::kScreamingSnake,
    /*methods=*/Case::kLowerCamel,
    /*functions=*/Case::kLowerCamel,
    /*fields=*/Case::kLowerCamel,
    /*variables=*/Case::kLowerCamel,
    /*variants=*/Case::kKeep,
    /*enum_variant_seperator=*/".",
    /*escape_keywords=*/Namer::Config::Escape::AfterConvertingCase,
    /*namespaces=*/Case::kKeep,
    /*namespace_seperator=*/".",
    /*object_prefix=*/"",
    /*object_suffix=*/"T",
    /*keyword_prefix=*/"",
    /*keyword_suffix=*/"_",
    /*filenames=*/Case::kKeep,
    /*directories=*/Case::kKeep,
    /*output_path=*/"",
    /*filename_suffix=*/"_generated",
    /*filename_extension=*/".java",
  };
}